

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.h
# Opt level: O3

void __thiscall
TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>::CopyFrom
          (TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
           *this,TPZMatrix<long_double> *mat)

{
  undefined8 uVar1;
  int64_t iVar2;
  STensorProductMTData *pSVar3;
  _func_int **pp_Var4;
  undefined4 uVar5;
  TPZMatrix<long_double> *cp;
  
  if (mat != (TPZMatrix<long_double> *)0x0) {
    cp = (TPZMatrix<long_double> *)
         __dynamic_cast(mat,&TPZMatrix<long_double>::typeinfo,
                        &TPZFrontMatrix<long_double,TPZStackEqnStorage<long_double>,TPZFrontNonSym<long_double>>
                         ::typeinfo,0);
    if (cp != (TPZMatrix<long_double> *)0x0) {
      TPZMatrix<long_double>::operator=((TPZMatrix<long_double> *)this,cp);
      TPZManVector<TPZEqnArray<long_double>,_10>::operator=
                (&(this->fStorage).fEqnStack.super_TPZManVector<TPZEqnArray<long_double>,_10>,
                 (TPZManVector<TPZEqnArray<long_double>,_10> *)&cp[1].super_TPZBaseMatrix.fCol);
      uVar1._0_1_ = cp[0x1998].super_TPZBaseMatrix.fDecomposed;
      uVar1._1_1_ = cp[0x1998].super_TPZBaseMatrix.fDefPositive;
      uVar1._2_6_ = *(undefined6 *)&cp[0x1998].super_TPZBaseMatrix.field_0x1a;
      (this->fFront).super_TPZFront<long_double>.fWork = (int)uVar1;
      (this->fFront).super_TPZFront<long_double>.fMaxFront = (int)((ulong)uVar1 >> 0x20);
      TPZManVector<long,_10>::operator=
                (&(this->fFront).super_TPZFront<long_double>.fGlobal,
                 (TPZManVector<long,_10> *)(cp + 0x1999));
      TPZVec<long>::operator=
                (&(this->fFront).super_TPZFront<long_double>.fLocal,
                 (TPZVec<long> *)&cp[0x199c].super_TPZBaseMatrix.fCol);
      iVar2 = *(int64_t *)&cp[0x199d].super_TPZBaseMatrix.fDecomposed;
      (this->fFront).super_TPZFront<long_double>.fFront = cp[0x199d].super_TPZBaseMatrix.fCol;
      (this->fFront).super_TPZFront<long_double>.fNextRigidBodyMode = iVar2;
      TPZManVector<int,_10>::operator=
                (&(this->fFront).super_TPZFront<long_double>.fFree.super_TPZManVector<int,_10>,
                 (TPZManVector<int,_10> *)(cp + 0x199e));
      TPZVec<long_double>::operator=
                (&(this->fFront).super_TPZFront<long_double>.fData,
                 (TPZVec<long_double> *)&cp[0x19a0].super_TPZBaseMatrix.fRow);
      uVar5 = *(undefined4 *)((long)&cp[0x19a1].super_TPZBaseMatrix.fRow + 4);
      pSVar3 = (STensorProductMTData *)cp[0x19a1].super_TPZBaseMatrix.fCol;
      (this->fFront).super_TPZFront<long_double>.fExpandRatio =
           *(undefined4 *)&cp[0x19a1].super_TPZBaseMatrix.fRow;
      (this->fFront).super_TPZFront<long_double>.fDecomposeType = uVar5;
      (this->fFront).super_TPZFront<long_double>.fProductMTData = pSVar3;
      pp_Var4 = cp[0x19a2].super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
      this->fNumEq = *(int64_t *)&cp[0x19a1].super_TPZBaseMatrix.fDecomposed;
      this->fLastDecomposed = (int64_t)pp_Var4;
      TPZVec<int>::operator=
                (&this->fNumElConnected,(TPZVec<int> *)&cp[0x19a2].super_TPZBaseMatrix.fRow);
      TPZVec<int>::operator=
                (&this->fNumElConnectedBackup,(TPZVec<int> *)&cp[0x19a3].super_TPZBaseMatrix.fRow);
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "virtual void TPZFrontMatrix<long double, TPZStackEqnStorage<long double>, TPZFrontNonSym<long double>>::CopyFrom(const TPZMatrix<TVar> *) [TVar = long double, store = TPZStackEqnStorage<long double>, front = TPZFrontNonSym<long double>]"
             ,0xec);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nERROR: Called with incompatible type\n.",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Aborting...\n",0xc);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Frontal/TPZFrontMatrix.h"
             ,0xb6);
}

Assistant:

void CopyFrom(const TPZMatrix<TVar> *  mat) override        
  {                                                           
    auto *from = dynamic_cast<const TPZFrontMatrix<TVar,store,front> *>(mat);                
    if (from) {                                               
      *this = *from;                                          
    }                                                         
    else                                                      
      {                                                       
        PZError<<__PRETTY_FUNCTION__;                         
        PZError<<"\nERROR: Called with incompatible type\n."; 
        PZError<<"Aborting...\n";                             
        DebugStop();                                          
      }                                                       
  }